

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

void zsummer::log4z::ShowColorText(char *text,int level)

{
  if (((uint)level < 6) && (level != 0)) {
    printf("%s%s\x1b[0m",cs_strColor + (ulong)(uint)level * 0x32);
    return;
  }
  printf("%s",text);
  return;
}

Assistant:

void ShowColorText(const char *text, int level)
{
	if (level < LOG_LEVEL_DEBUG || level > LOG_LEVEL_FATAL)
    {
	    printf("%s", text);
	    return;
    }

	if (level == LOG_LEVEL_DEBUG)
    {
	    printf("%s", text);
	    return;
    }

#ifndef WIN32
	printf("%s%s\e[0m", cs_strColor[level], text);
#else
	HANDLE hStd = ::GetStdHandle(STD_OUTPUT_HANDLE);
	if (hStd == INVALID_HANDLE_VALUE)
    {
	    printf("%s", text);
	    return;
    }
	CONSOLE_SCREEN_BUFFER_INFO oldInfo;
	if (!GetConsoleScreenBufferInfo(hStd, &oldInfo))
    {
	    printf("%s", text);
	    return;
    }

	{
		CAutoLock l(gs_ShowColorTextLock);
		SetConsoleTextAttribute(hStd, cs_sColor[level]);
		printf("%s", text);
		SetConsoleTextAttribute(hStd, oldInfo.wAttributes);
	}


#endif

	return;
}